

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

Ses_Man_t *
Ses_ManAlloc(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int fMakeAIG,
            int nBTLimit,int fVerbose)

{
  uint nWords;
  int iVar1;
  Ses_Man_t *pSVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  word *pwVar8;
  int iVar;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  word wVar13;
  word local_58 [5];
  
  pSVar2 = (Ses_Man_t *)calloc(1,0x488);
  pSVar2->pSat = (sat_solver *)0x0;
  pSVar2->bSpecInv = 0;
  if (0 < nFunc) {
    iVar9 = 0;
    uVar7 = 0;
    do {
      if ((pTruth[(int)uVar7 * 4] & 1) != 0) {
        lVar12 = 0;
        do {
          pTruth[iVar9 + lVar12] = ~pTruth[iVar9 + lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        pSVar2->bSpecInv = pSVar2->bSpecInv | 1 << ((byte)uVar7 & 0x1f);
      }
      uVar7 = uVar7 + 1;
      iVar9 = iVar9 + 4;
    } while (uVar7 != (uint)nFunc);
  }
  pSVar2->pSpec = pTruth;
  pSVar2->nSpecVars = nVars;
  pSVar2->nSpecFunc = nFunc;
  iVar9 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    iVar9 = 1;
  }
  pSVar2->nSpecWords = iVar9;
  pSVar2->nRows = ~(-1 << ((byte)nVars & 0x1f));
  iVar9 = 0;
  if (nMaxDepth < 0) {
    pArrTimeProfile = (int *)0x0;
  }
  pSVar2->nMaxDepth = nMaxDepth;
  pSVar2->pArrTimeProfile = pArrTimeProfile;
  if (pArrTimeProfile == (int *)0x0) {
    pSVar2->nArrTimeMax = 0;
  }
  else {
    iVar9 = Abc_NormalizeArrivalTimes(pArrTimeProfile,nVars,&pSVar2->nArrTimeMax);
  }
  pSVar2->nArrTimeDelta = iVar9;
  pSVar2->fMakeAIG = fMakeAIG;
  pSVar2->nBTLimit = nBTLimit;
  pSVar2->fVerbose = fVerbose;
  pSVar2->fVeryVerbose = 0;
  pSVar2->fExtractVerbose = 0;
  piVar5 = (int *)0x0;
  pSVar2->fSatVerbose = 0;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar3->pArray = piVar4;
  pSVar2->vPolar = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0x10;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  pVVar3->pArray = piVar4;
  pSVar2->vAssump = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < nVars - 1U) {
    iVar9 = nVars;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar9;
  if (iVar9 != 0) {
    piVar5 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar3->pArray = piVar5;
  pSVar2->vStairDecVars = pVVar3;
  pSVar2->nRandRowAssigns = nVars * 2;
  pSVar2->fKeepRowAssigns = 0;
  if (pSVar2->nSpecFunc == 1) {
    nWords = pSVar2->nSpecWords;
    if ((int)nWords < 0) {
      __assert_fail("nBits >= 0 && nBits <= nWords * 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0xc6,"void Abc_TtMask(word *, int, int)");
    }
    if ((ulong)nWords != 0) {
      uVar6 = (ulong)(nWords << 6);
      pwVar8 = local_58;
      uVar7 = 0;
      uVar11 = uVar6;
      do {
        uVar10 = uVar7 + 0x40;
        wVar13 = 0xffffffffffffffff;
        if (uVar6 < uVar10) {
          if (uVar7 < uVar6) {
            if (0x40 < uVar11) {
              __assert_fail("nBits >= 0 && nBits <= 64",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                            ,0xc2,"word Abc_Tt6Mask(int)");
            }
          }
          else {
            wVar13 = 0;
          }
        }
        *pwVar8 = wVar13;
        pwVar8 = pwVar8 + 1;
        uVar11 = uVar11 - 0x40;
        uVar7 = uVar10;
      } while ((ulong)nWords << 6 != uVar10);
    }
    iVar9 = pSVar2->nSpecVars;
    if (0 < iVar9) {
      pwVar8 = pSVar2->pSpec;
      iVar = 0;
      do {
        iVar1 = Abc_TtIsTopDecomposable(pwVar8,local_58,nWords,iVar);
        if (iVar1 != 0) {
          pSVar2->pDecVars = pSVar2->pDecVars | 1 << ((byte)iVar & 0x1f);
        }
        iVar = iVar + 1;
      } while (iVar9 != iVar);
    }
  }
  srand(0xcafe);
  return pSVar2;
}

Assistant:

static inline Ses_Man_t * Ses_ManAlloc( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int fMakeAIG, int nBTLimit, int fVerbose )
{
    int h, i;

    Ses_Man_t * p = ABC_CALLOC( Ses_Man_t, 1 );
    p->pSat       = NULL;
    p->bSpecInv   = 0;
    for ( h = 0; h < nFunc; ++h )
        if ( pTruth[h << 2] & 1 )
        {
            for ( i = 0; i < 4; ++i )
                pTruth[(h << 2) + i] = ~pTruth[(h << 2) + i];
            p->bSpecInv |= ( 1 << h );
        }
    p->pSpec           = pTruth;
    p->nSpecVars       = nVars;
    p->nSpecFunc       = nFunc;
    p->nSpecWords      = Abc_TtWordNum( nVars );
    p->nRows           = ( 1 << nVars ) - 1;
    p->nMaxDepth       = nMaxDepth;
    p->pArrTimeProfile = nMaxDepth >= 0 ? pArrTimeProfile : NULL;
    if ( p->pArrTimeProfile )
        p->nArrTimeDelta = Abc_NormalizeArrivalTimes( p->pArrTimeProfile, nVars, &p->nArrTimeMax );
    else
        p->nArrTimeDelta = p->nArrTimeMax = 0;
    p->fMakeAIG        = fMakeAIG;
    p->nBTLimit        = nBTLimit;
    p->fVerbose        = fVerbose;
    p->fVeryVerbose    = 0;
    p->fExtractVerbose = 0;
    p->fSatVerbose     = 0;
    p->vPolar          = Vec_IntAlloc( 100 );
    p->vAssump         = Vec_IntAlloc( 10 );
    p->vStairDecVars   = Vec_IntAlloc( nVars );
    p->nRandRowAssigns = 2 * nVars;
    p->fKeepRowAssigns = 0;

    if ( p->nSpecFunc == 1 )
        Ses_ManComputeTopDec( p );

    srand( 0xCAFE );

    return p;
}